

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::UaddCarryCase::UaddCarryCase
          (UaddCarryCase *this,Context *context,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *pvVar1;
  allocator<char> local_a1;
  VarType local_a0;
  string local_88;
  Symbol local_68;
  
  getIntegerFuncCaseName_abi_cxx11_
            (&local_68.name,(Functional *)(ulong)baseType,precision,shaderType,shaderType);
  IntegerFunctionCase::IntegerFunctionCase
            (&this->super_IntegerFunctionCase,context,local_68.name._M_dataplus._M_p,"uaddCarry",
             shaderType);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_IntegerFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_01e4cc30;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"x",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  pvVar1 = &(this->super_IntegerFunctionCase).m_spec.inputs;
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>(pvVar1,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"y",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>(pvVar1,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"sum",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  pvVar1 = &(this->super_IntegerFunctionCase).m_spec.outputs;
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>(pvVar1,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"carry",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,PRECISION_LOWP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>(pvVar1,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::assign((char *)&(this->super_IntegerFunctionCase).m_spec.source);
  return;
}

Assistant:

UaddCarryCase (Context& context, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: IntegerFunctionCase(context, getIntegerFuncCaseName(baseType, precision, shaderType).c_str(), "uaddCarry", shaderType)
	{
		m_spec.inputs.push_back(Symbol("x", glu::VarType(baseType, precision)));
		m_spec.inputs.push_back(Symbol("y", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("sum", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("carry", glu::VarType(baseType, glu::PRECISION_LOWP)));
		m_spec.source = "sum = uaddCarry(x, y, carry);";
	}